

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

ssize_t nghttp2_session_mem_send_internal(nghttp2_session *session,uint8_t **data_ptr,int fast_cb)

{
  nghttp2_mem *mem;
  nghttp2_active_outbound_item *aob;
  nghttp2_bufs *bufs;
  nghttp2_hd_deflater *deflater;
  nghttp2_map_key_type nVar1;
  uint uVar2;
  nghttp2_outbound_item *pnVar3;
  nghttp2_before_frame_send_callback p_Var4;
  nghttp2_on_frame_not_send_callback p_Var5;
  nghttp2_pack_extension_callback p_Var6;
  uint8_t *puVar7;
  uint8_t uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  nghttp2_frame *pnVar12;
  nghttp2_stream *pnVar13;
  size_t sVar14;
  void *pvVar15;
  long lVar16;
  ulong uVar17;
  nghttp2_buf_chain *pnVar18;
  uint32_t uVar19;
  ulong uVar20;
  int32_t stream_id;
  uint8_t *puVar21;
  
  uVar9 = nghttp2_session_adjust_idle_stream(session);
  if ((int)uVar9 < -900) {
LAB_006bd06b:
    return (long)(int)uVar9;
  }
  mem = &session->mem;
  aob = &session->aob;
  bufs = &(session->aob).framebufs;
  deflater = &session->hd_deflater;
switchD_006bc3ab_default:
  do {
    switch((session->aob).state) {
    case NGHTTP2_OB_POP_ITEM:
      pnVar12 = &nghttp2_session_pop_next_ob_item(session)->frame;
      if (pnVar12 == (nghttp2_frame *)0x0) {
        return 0;
      }
      uVar8 = (pnVar12->hd).type;
      switch(uVar8) {
      case '\0':
        pnVar13 = (nghttp2_stream *)nghttp2_map_find(&session->streams,(pnVar12->hd).stream_id);
        uVar9 = 0xfffffe02;
        if (((pnVar13 != (nghttp2_stream *)0x0) && ((pnVar13->flags & 2) == 0)) &&
           (pnVar13->state != NGHTTP2_STREAM_IDLE)) {
          if (&pnVar13->item->frame != pnVar12) {
            __assert_fail("stream->item == item",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                          ,0x91a,
                          "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
          }
          uVar9 = nghttp2_session_predicate_data_send(session,pnVar13);
          if (uVar9 == 0) {
            uVar9 = session->remote_window_size;
            uVar11 = pnVar13->remote_window_size;
            if ((int)uVar9 <= pnVar13->remote_window_size) {
              uVar11 = uVar9;
            }
            uVar2 = (session->remote_settings).max_frame_size;
            if ((int)uVar2 <= (int)uVar11) {
              uVar11 = uVar2;
            }
            if ((int)uVar11 < 1) {
              if ((int)uVar9 < 1) {
                __assert_fail("session->remote_window_size > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                              ,0x937,
                              "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
              }
              uVar8 = '\x04';
LAB_006bcf19:
              uVar9 = session_defer_stream_item(session,pnVar13,uVar8);
              if (-0x385 < (int)uVar9) {
                aob->item = (nghttp2_outbound_item *)0x0;
                goto LAB_006bc542;
              }
            }
            else {
              if (0x3fff < uVar11) {
                uVar11 = 0x4000;
              }
              uVar9 = nghttp2_session_pack_data
                                (session,bufs,(ulong)uVar11,pnVar12,
                                 (nghttp2_data_aux_data *)((long)pnVar12 + 0x60),pnVar13);
              if ((int)uVar9 < -0x1fc) {
                if (uVar9 == 0xfffffdf7) {
                  uVar9 = session_detach_stream_item(session,pnVar13);
                  if (-0x385 < (int)uVar9) {
                    uVar9 = nghttp2_session_add_rst_stream(session,(pnVar12->hd).stream_id,2);
                    uVar11 = 0xfffffdf7;
                    if (-0x385 < (int)uVar9) break;
                  }
                  goto LAB_006bc642;
                }
                if (uVar9 == 0xfffffdf2) {
                  return 0;
                }
              }
              else {
                if (uVar9 == 0) goto LAB_006bc9b2;
                if (uVar9 == 0xfffffe04) {
                  uVar8 = '\b';
                  goto LAB_006bcf19;
                }
              }
              uVar11 = session_detach_stream_item(session,pnVar13);
              if ((int)uVar11 < -900) {
                uVar9 = uVar11;
              }
            }
            goto LAB_006bc642;
          }
        }
        pnVar13 = (nghttp2_stream *)nghttp2_map_find(&session->streams,(pnVar12->hd).stream_id);
        if ((pnVar13 != (nghttp2_stream *)0x0) &&
           (uVar11 = session_detach_stream_item(session,pnVar13), (int)uVar11 < -900)) {
          uVar9 = uVar11;
        }
        goto LAB_006bc642;
      case '\x01':
        if ((pnVar12->headers).cat == NGHTTP2_HCAT_REQUEST) {
          pnVar13 = nghttp2_session_open_stream
                              (session,(pnVar12->hd).stream_id,'\0',&(pnVar12->headers).pri_spec,
                               NGHTTP2_STREAM_INITIAL,*(void **)((long)pnVar12 + 0x70));
          if (pnVar13 == (nghttp2_stream *)0x0) {
            uVar11 = 0xfffffc7b;
          }
          else {
            uVar11 = 0xfffffe01;
            if (((*(char *)((long)pnVar12 + 0x7c) == '\0') &&
                (uVar11 = 0xfffffdfc, (session->goaway_flags & 8) == 0)) &&
               (iVar10 = session_is_closing(session), iVar10 == 0)) {
              if ((session->opt_flags & 4) == 0) {
                nghttp2_http_record_request_method(pnVar13,pnVar12);
              }
              goto LAB_006bce8a;
            }
          }
        }
        else {
          pnVar13 = (nghttp2_stream *)nghttp2_map_find(&session->streams,(pnVar12->hd).stream_id);
          if (((pnVar13 == (nghttp2_stream *)0x0) || ((pnVar13->flags & 2) != 0)) ||
             (pnVar13->state == NGHTTP2_STREAM_IDLE)) {
            (pnVar12->headers).cat = NGHTTP2_HCAT_HEADERS;
LAB_006bc99d:
            uVar11 = 0xfffffe02;
          }
          else {
            if (pnVar13->state == NGHTTP2_STREAM_RESERVED) {
              uVar9 = session_predicate_push_response_headers_send(session,pnVar13);
              if (uVar9 != 0) goto LAB_006bc642;
              (pnVar12->headers).cat = NGHTTP2_HCAT_PUSH_RESPONSE;
              if (*(void **)((long)pnVar12 + 0x70) != (void *)0x0) {
                pnVar13->stream_user_data = *(void **)((long)pnVar12 + 0x70);
              }
            }
            else {
              iVar10 = session_predicate_response_headers_send(session,pnVar13);
              if (iVar10 != 0) {
                (pnVar12->headers).cat = NGHTTP2_HCAT_HEADERS;
                iVar10 = session_is_closing(session);
                uVar11 = 0xfffffdee;
                if ((iVar10 == 0) && (uVar11 = 0xfffffe00, (pnVar13->shut_flags & 2) == 0)) {
                  if (pnVar13->state == NGHTTP2_STREAM_OPENED) goto LAB_006bce8a;
                  uVar11 = 0xfffffe01;
                  if (pnVar13->state != NGHTTP2_STREAM_CLOSING) {
                    uVar11 = 0xfffffdfe;
                    if ((pnVar13->stream_id != 0) &&
                       (((session->server == '\0' ^ (byte)pnVar13->stream_id) & 1) == 0))
                    goto LAB_006bce8a;
                  }
                }
                break;
              }
              (pnVar12->headers).cat = NGHTTP2_HCAT_RESPONSE;
            }
LAB_006bce8a:
            sVar14 = nghttp2_hd_deflate_bound
                               (deflater,(pnVar12->headers).nva,(pnVar12->headers).nvlen);
            uVar11 = 0xfffffdf6;
            if (sVar14 + 5 <= session->max_send_header_block_length) {
              uVar9 = nghttp2_frame_pack_headers(bufs,&pnVar12->headers,deflater);
              if ((uVar9 == 0) && (uVar9 = session_headers_add_pad(session,pnVar12), uVar9 == 0)) {
                if ((pnVar12->headers).cat == NGHTTP2_HCAT_REQUEST) {
                  iVar10 = (pnVar12->hd).stream_id;
                  if (iVar10 <= session->last_sent_stream_id) {
                    __assert_fail("session->last_sent_stream_id < frame->hd.stream_id",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                                  ,0x9c9,
                                  "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)"
                                 );
                  }
LAB_006bcefa:
                  session->last_sent_stream_id = iVar10;
                }
                goto LAB_006bc9b2;
              }
              goto LAB_006bc642;
            }
          }
        }
        break;
      case '\x02':
        iVar10 = session_is_closing(session);
        uVar11 = 0xfffffdee;
        if (iVar10 != 0) break;
        nghttp2_frame_pack_priority(bufs,&pnVar12->priority);
        goto LAB_006bc9b2;
      case '\x03':
        iVar10 = session_is_closing(session);
        uVar11 = 0xfffffdee;
        if (iVar10 == 0) {
          nghttp2_frame_pack_rst_stream(bufs,&pnVar12->rst_stream);
          goto LAB_006bc9b2;
        }
        break;
      case '\x04':
        if (((pnVar12->hd).flags & 1) != 0) {
          if (session->obq_flood_counter_ == 0) {
            __assert_fail("session->obq_flood_counter_ > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                          ,0x9e5,
                          "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
          }
          session->obq_flood_counter_ = session->obq_flood_counter_ - 1;
          iVar10 = session_is_closing(session);
          uVar11 = 0xfffffdee;
          if (iVar10 != 0) break;
        }
        uVar9 = nghttp2_frame_pack_settings(bufs,&pnVar12->settings);
        goto LAB_006bc642;
      case '\x05':
        pvVar15 = nghttp2_map_find(&session->streams,(pnVar12->hd).stream_id);
        if (((pvVar15 == (void *)0x0) || ((*(byte *)((long)pvVar15 + 0xd8) & 2) != 0)) ||
           (*(int *)((long)pvVar15 + 0xcc) == 5)) {
          pvVar15 = (void *)0x0;
        }
        if (session->server == '\0') {
          uVar11 = 0xfffffe07;
        }
        else {
          if (pvVar15 == (void *)0x0) goto LAB_006bc99d;
          iVar10 = session_is_closing(session);
          uVar11 = 0xfffffdee;
          if ((iVar10 == 0) && (uVar11 = 0xfffffe00, (*(byte *)((long)pvVar15 + 0xd9) & 2) == 0)) {
            if ((session->remote_settings).enable_push == 0) {
              uVar11 = 0xfffffdf0;
            }
            else {
              uVar11 = 0xfffffe01;
              if ((*(int *)((long)pvVar15 + 0xcc) != 3) &&
                 (uVar11 = 0xfffffdfc, (session->goaway_flags & 8) == 0)) {
                sVar14 = nghttp2_hd_deflate_bound
                                   (deflater,(pnVar12->push_promise).nva,
                                    (pnVar12->push_promise).nvlen);
                uVar11 = 0xfffffdf6;
                if (sVar14 <= session->max_send_header_block_length) {
                  uVar9 = nghttp2_frame_pack_push_promise(bufs,&pnVar12->push_promise,deflater);
                  if ((uVar9 != 0) || (uVar9 = session_headers_add_pad(session,pnVar12), uVar9 != 0)
                     ) goto LAB_006bc642;
                  iVar10 = (pnVar12->push_promise).promised_stream_id;
                  if (iVar10 < session->last_sent_stream_id + 2) {
                    __assert_fail("session->last_sent_stream_id + 2 <= frame->push_promise.promised_stream_id"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                                  ,0xa18,
                                  "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)"
                                 );
                  }
                  goto LAB_006bcefa;
                }
              }
            }
          }
        }
        break;
      case '\x06':
        if (((pnVar12->hd).flags & 1) != 0) {
          if (session->obq_flood_counter_ == 0) {
            __assert_fail("session->obq_flood_counter_ > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                          ,0xa1f,
                          "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
          }
          session->obq_flood_counter_ = session->obq_flood_counter_ - 1;
        }
        uVar11 = 0xfffffdee;
        if ((session->goaway_flags & 1) == 0) {
          nghttp2_frame_pack_ping(bufs,&pnVar12->ping);
          goto LAB_006bc9b2;
        }
        break;
      case '\a':
        uVar9 = nghttp2_frame_pack_goaway(bufs,&pnVar12->goaway);
        if (uVar9 == 0) {
          session->local_last_stream_id = (pnVar12->priority).pri_spec.stream_id;
          goto LAB_006bc9b2;
        }
LAB_006bc642:
        if (uVar9 == 0xfffffe04) goto switchD_006bc3ab_default;
        if (uVar9 == 0xfffffdf2) {
          return 0;
        }
        uVar11 = uVar9;
        if (-1 < (int)uVar9) {
LAB_006bc9b2:
          (session->aob).item = (nghttp2_outbound_item *)pnVar12;
          (session->aob).framebufs.cur = (session->aob).framebufs.head;
          if ((pnVar12->hd).type == '\0') {
            if (*(char *)((long)pnVar12 + 0x72) != '\0') {
              (session->aob).state = NGHTTP2_OB_SEND_NO_COPY;
              goto switchD_006bc3ab_default;
            }
          }
          else {
            p_Var4 = (session->callbacks).before_frame_send_callback;
            if ((p_Var4 != (nghttp2_before_frame_send_callback)0x0) &&
               (iVar10 = (*p_Var4)(session,pnVar12,session->user_data), iVar10 != 0)) {
              if (iVar10 != -0x217) {
                return -0x386;
              }
              p_Var5 = (session->callbacks).on_frame_not_send_callback;
              if ((p_Var5 != (nghttp2_on_frame_not_send_callback)0x0) &&
                 (iVar10 = (*p_Var5)(session,pnVar12,-0x217,session->user_data), iVar10 != 0)) {
                return -0x386;
              }
              if ((pnVar12->hd).type == '\x05') {
                uVar19 = 2;
                lVar16 = 0x28;
LAB_006bcc54:
                if (*(int32_t *)((long)pnVar12 + lVar16) != 0) {
                  uVar9 = nghttp2_session_close_stream
                                    (session,*(int32_t *)((long)pnVar12 + lVar16),uVar19);
LAB_006bcc67:
                  if ((int)uVar9 < -900) goto LAB_006bd06b;
                }
              }
              else if (((pnVar12->hd).type == '\x01') &&
                      ((pnVar12->headers).cat == NGHTTP2_HCAT_REQUEST)) {
                uVar19 = 7;
                lVar16 = 8;
                goto LAB_006bcc54;
              }
LAB_006bc542:
              active_outbound_item_reset(aob,mem);
              goto switchD_006bc3ab_default;
            }
          }
          (session->aob).state = NGHTTP2_OB_SEND_DATA;
          goto switchD_006bc3ab_default;
        }
        break;
      case '\b':
        nVar1 = (pnVar12->hd).stream_id;
        iVar10 = session_is_closing(session);
        uVar11 = 0xfffffdee;
        if (iVar10 == 0) {
          if (nVar1 == 0) {
LAB_006bc8b7:
            nghttp2_frame_pack_window_update(bufs,&pnVar12->window_update);
            goto LAB_006bc9b2;
          }
          pvVar15 = nghttp2_map_find(&session->streams,nVar1);
          uVar11 = 0xfffffe02;
          if ((pvVar15 != (void *)0x0) && ((*(byte *)((long)pvVar15 + 0xd8) & 2) == 0)) {
            iVar10 = *(int *)((long)pvVar15 + 0xcc);
            if (iVar10 == 3) goto LAB_006bce6d;
            if ((iVar10 != 5) &&
               (((iVar10 != 4 || (*(int *)((long)pvVar15 + 0xa8) == 0)) ||
                (uVar11 = 0xfffffdfe,
                ((session->server == '\0' ^ (byte)*(int *)((long)pvVar15 + 0xa8)) & 1) != 0))))
            goto LAB_006bc8b7;
          }
        }
        break;
      case '\t':
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                      ,0xa3b,"int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
      default:
        if (*(char *)((long)pnVar12 + 0x60) == '\0') {
          iVar10 = session_is_closing(session);
          uVar11 = 0xfffffdee;
          if (iVar10 == 0) {
            p_Var6 = (session->callbacks).pack_extension_callback;
            if (p_Var6 == (nghttp2_pack_extension_callback)0x0) {
              __assert_fail("session->callbacks.pack_extension_callback",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                            ,0x8e7,
                            "int session_pack_extension(nghttp2_session *, nghttp2_bufs *, nghttp2_frame *)"
                           );
            }
            pnVar18 = (session->aob).framebufs.head;
            puVar21 = (pnVar18->buf).last;
            uVar20 = (long)(pnVar18->buf).end - (long)puVar21;
            if (0x3fff < uVar20) {
              uVar20 = 0x4000;
            }
            uVar17 = (*p_Var6)(session,puVar21,uVar20,pnVar12,session->user_data);
            uVar11 = 0xfffffde9;
            if ((uVar17 != 0xfffffffffffffde9) && (uVar11 = 0xfffffc7a, uVar17 <= uVar20)) {
              (pnVar12->hd).length = uVar17;
              puVar21 = (pnVar18->buf).pos;
              puVar7 = (pnVar18->buf).last;
              if (puVar21 != puVar7) {
                __assert_fail("buf->pos == buf->last",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                              ,0x8fa,
                              "int session_pack_extension(nghttp2_session *, nghttp2_bufs *, nghttp2_frame *)"
                             );
              }
              (pnVar18->buf).last = puVar7 + uVar17;
              puVar21 = puVar21 + -9;
              (pnVar18->buf).pos = puVar21;
              nghttp2_frame_pack_frame_hd(puVar21,&pnVar12->hd);
              goto LAB_006bc9b2;
            }
          }
        }
        else if (uVar8 == '\x10') {
          nVar1 = *(pnVar12->ext).payload;
          iVar10 = session_is_closing(session);
          uVar11 = 0xfffffdee;
          if (iVar10 == 0) {
            pvVar15 = nghttp2_map_find(&session->streams,nVar1);
            if ((pvVar15 == (void *)0x0) || ((*(byte *)((long)pvVar15 + 0xd8) & 2) != 0)) {
LAB_006bcc38:
              nghttp2_frame_pack_priority_update(bufs,&pnVar12->ext);
              goto LAB_006bc9b2;
            }
            if (*(int *)((long)pvVar15 + 0xcc) == 3) {
LAB_006bce6d:
              uVar11 = 0xfffffe01;
            }
            else if ((*(int *)((long)pvVar15 + 0xcc) == 5) ||
                    (uVar11 = 0xfffffdfe, (*(byte *)((long)pvVar15 + 0xd9) & 1) == 0))
            goto LAB_006bcc38;
          }
        }
        else if (uVar8 == '\f') {
          iVar10 = session_is_closing(session);
          uVar11 = 0xfffffdee;
          if (iVar10 == 0) {
            uVar9 = nghttp2_frame_pack_origin(bufs,&pnVar12->ext);
            goto LAB_006bc642;
          }
        }
        else {
          if (uVar8 != '\n') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                          ,0xa70,
                          "int session_prep_frame(nghttp2_session *, nghttp2_outbound_item *)");
          }
          nVar1 = (pnVar12->hd).stream_id;
          iVar10 = session_is_closing(session);
          uVar11 = 0xfffffdee;
          if (iVar10 == 0) {
            if (nVar1 == 0) {
LAB_006bc949:
              nghttp2_frame_pack_altsvc(bufs,&pnVar12->ext);
              goto LAB_006bc9b2;
            }
            pvVar15 = nghttp2_map_find(&session->streams,nVar1);
            uVar11 = 0xfffffe02;
            if ((pvVar15 != (void *)0x0) && ((*(byte *)((long)pvVar15 + 0xd8) & 2) == 0)) {
              if (*(int *)((long)pvVar15 + 0xcc) == 3) goto LAB_006bce6d;
              if (*(int *)((long)pvVar15 + 0xcc) != 5) goto LAB_006bc949;
            }
          }
        }
      }
      uVar8 = (pnVar12->hd).type;
      if (uVar8 != '\0') {
        p_Var5 = (session->callbacks).on_frame_not_send_callback;
        if ((p_Var5 != (nghttp2_on_frame_not_send_callback)0x0) &&
           (uVar8 != '\b' && 0xfffffc7c < uVar11)) {
          iVar10 = (*p_Var5)(session,pnVar12,uVar11,session->user_data);
          if (iVar10 != 0) {
            nghttp2_outbound_item_free((nghttp2_outbound_item *)&pnVar12->hd,mem);
            nghttp2_mem_free(mem,pnVar12);
            return -0x386;
          }
          uVar8 = (pnVar12->hd).type;
        }
        if (uVar8 == '\x05') {
          stream_id = (pnVar12->push_promise).promised_stream_id;
          uVar19 = 2;
        }
        else {
          if ((uVar8 != '\x01') || ((pnVar12->headers).cat != NGHTTP2_HCAT_REQUEST))
          goto LAB_006bcd05;
          stream_id = (pnVar12->hd).stream_id;
          if (*(char *)((long)pnVar12 + 0x7c) == '\0') {
            uVar19 = 7;
          }
          else {
            uVar19 = *(uint32_t *)((long)pnVar12 + 0x78);
          }
        }
        if ((stream_id != 0) &&
           (uVar9 = nghttp2_session_close_stream(session,stream_id,uVar19), (int)uVar9 < -900))
        goto LAB_006bd06b;
      }
LAB_006bcd05:
      nghttp2_outbound_item_free((nghttp2_outbound_item *)&pnVar12->hd,mem);
      nghttp2_mem_free(mem,pnVar12);
      active_outbound_item_reset(aob,mem);
      if (uVar11 == 0xfffffdf5) {
        uVar11 = session_terminate_session(session,session->last_proc_stream_id,2,(char *)0x0);
      }
      if ((int)uVar11 < -900) {
        return (long)(int)uVar11;
      }
      break;
    case NGHTTP2_OB_SEND_DATA:
      pnVar18 = (session->aob).framebufs.cur;
      puVar21 = (pnVar18->buf).pos;
      if (puVar21 != (pnVar18->buf).last) {
LAB_006bcfaa:
        *data_ptr = puVar21;
        puVar21 = (pnVar18->buf).last;
        puVar7 = (pnVar18->buf).pos;
        (pnVar18->buf).pos = puVar21;
        return (long)puVar21 - (long)puVar7;
      }
      if ((fast_cb == 0) && (uVar9 = session_after_frame_sent1(session), (int)uVar9 < 0)) {
        if (0xfffffc7b < uVar9) {
          __assert_fail("nghttp2_is_fatal(rv)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                        ,0xd8a,
                        "ssize_t nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                       );
        }
        goto LAB_006bd06b;
      }
      uVar9 = session_after_frame_sent2(session);
      if ((int)uVar9 < 0) {
        if (0xfffffc7b < uVar9) {
          __assert_fail("nghttp2_is_fatal(rv)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                        ,0xd91,
                        "ssize_t nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                       );
        }
        goto LAB_006bd06b;
      }
      break;
    case NGHTTP2_OB_SEND_NO_COPY:
      pnVar3 = (session->aob).item;
      pnVar13 = (nghttp2_stream *)nghttp2_map_find(&session->streams,(pnVar3->frame).hd.stream_id);
      if (((pnVar13 == (nghttp2_stream *)0x0) || ((pnVar13->flags & 2) != 0)) ||
         (pnVar13->state == NGHTTP2_STREAM_IDLE)) goto LAB_006bc542;
      pnVar12 = &((session->aob).item)->frame;
      iVar10 = (*(session->callbacks).send_data_callback)
                         (session,pnVar12,(((session->aob).framebufs.cur)->buf).pos,
                          (pnVar12->hd).length - (pnVar12->data).padlen,
                          (nghttp2_data_source *)((long)pnVar12 + 0x60),session->user_data);
      if (iVar10 < -0x1f8) {
        if (iVar10 == -0x20e) goto LAB_006bc960;
        if (iVar10 != -0x209) {
          return -0x386;
        }
        uVar9 = session_detach_stream_item(session,pnVar13);
        if (-0x385 < (int)uVar9) {
          uVar9 = nghttp2_session_add_rst_stream(session,(pnVar3->frame).hd.stream_id,2);
          goto LAB_006bcc67;
        }
      }
      else {
        if (iVar10 != 0) {
          if (iVar10 == -0x1f8) {
            return 0;
          }
          return -0x386;
        }
LAB_006bc960:
        uVar9 = session_after_frame_sent1(session);
        if ((int)uVar9 < 0) {
          if (0xfffffc7b < uVar9) {
            __assert_fail("nghttp2_is_fatal(rv)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                          ,0xdd2,
                          "ssize_t nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                         );
          }
        }
        else {
          uVar9 = session_after_frame_sent2(session);
          if (-1 < (int)uVar9) goto code_r0x006bc980;
          if (0xfffffc7b < uVar9) {
            __assert_fail("nghttp2_is_fatal(rv)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                          ,0xdd7,
                          "ssize_t nghttp2_session_mem_send_internal(nghttp2_session *, const uint8_t **, int)"
                         );
          }
        }
      }
      goto LAB_006bd06b;
    case NGHTTP2_OB_SEND_CLIENT_MAGIC:
      pnVar18 = (session->aob).framebufs.cur;
      puVar21 = (pnVar18->buf).pos;
      if (puVar21 != (pnVar18->buf).last) goto LAB_006bcfaa;
      goto LAB_006bc542;
    }
  } while( true );
code_r0x006bc980:
  if (iVar10 == -0x20e) {
    return 0;
  }
  goto switchD_006bc3ab_default;
}

Assistant:

static ssize_t nghttp2_session_mem_send_internal(nghttp2_session *session,
                                                 const uint8_t **data_ptr,
                                                 int fast_cb) {
  int rv;
  nghttp2_active_outbound_item *aob;
  nghttp2_bufs *framebufs;
  nghttp2_mem *mem;

  mem = &session->mem;
  aob = &session->aob;
  framebufs = &aob->framebufs;

  /* We may have idle streams more than we expect (e.g.,
     nghttp2_session_change_stream_priority() or
     nghttp2_session_create_idle_stream()).  Adjust them here. */
  rv = nghttp2_session_adjust_idle_stream(session);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  for (;;) {
    switch (aob->state) {
    case NGHTTP2_OB_POP_ITEM: {
      nghttp2_outbound_item *item;

      item = nghttp2_session_pop_next_ob_item(session);
      if (item == NULL) {
        return 0;
      }

      rv = session_prep_frame(session, item);
      if (rv == NGHTTP2_ERR_PAUSE) {
        return 0;
      }
      if (rv == NGHTTP2_ERR_DEFERRED) {
        DEBUGF("send: frame transmission deferred\n");
        break;
      }
      if (rv < 0) {
        int32_t opened_stream_id = 0;
        uint32_t error_code = NGHTTP2_INTERNAL_ERROR;

        DEBUGF("send: frame preparation failed with %s\n",
               nghttp2_strerror(rv));
        /* TODO If the error comes from compressor, the connection
           must be closed. */
        if (item->frame.hd.type != NGHTTP2_DATA &&
            session->callbacks.on_frame_not_send_callback && is_non_fatal(rv)) {
          nghttp2_frame *frame = &item->frame;
          /* The library is responsible for the transmission of
             WINDOW_UPDATE frame, so we don't call error callback for
             it. */
          if (frame->hd.type != NGHTTP2_WINDOW_UPDATE &&
              session->callbacks.on_frame_not_send_callback(
                  session, frame, rv, session->user_data) != 0) {

            nghttp2_outbound_item_free(item, mem);
            nghttp2_mem_free(mem, item);

            return NGHTTP2_ERR_CALLBACK_FAILURE;
          }
        }
        /* We have to close stream opened by failed request HEADERS
           or PUSH_PROMISE. */
        switch (item->frame.hd.type) {
        case NGHTTP2_HEADERS:
          if (item->frame.headers.cat == NGHTTP2_HCAT_REQUEST) {
            opened_stream_id = item->frame.hd.stream_id;
            if (item->aux_data.headers.canceled) {
              error_code = item->aux_data.headers.error_code;
            } else {
              /* Set error_code to REFUSED_STREAM so that application
                 can send request again. */
              error_code = NGHTTP2_REFUSED_STREAM;
            }
          }
          break;
        case NGHTTP2_PUSH_PROMISE:
          opened_stream_id = item->frame.push_promise.promised_stream_id;
          break;
        }
        if (opened_stream_id) {
          /* careful not to override rv */
          int rv2;
          rv2 = nghttp2_session_close_stream(session, opened_stream_id,
                                             error_code);

          if (nghttp2_is_fatal(rv2)) {
            return rv2;
          }
        }

        nghttp2_outbound_item_free(item, mem);
        nghttp2_mem_free(mem, item);
        active_outbound_item_reset(aob, mem);

        if (rv == NGHTTP2_ERR_HEADER_COMP) {
          /* If header compression error occurred, should terminiate
             connection. */
          rv = nghttp2_session_terminate_session(session,
                                                 NGHTTP2_INTERNAL_ERROR);
        }
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }
        break;
      }

      aob->item = item;

      nghttp2_bufs_rewind(framebufs);

      if (item->frame.hd.type != NGHTTP2_DATA) {
        nghttp2_frame *frame;

        frame = &item->frame;

        DEBUGF("send: next frame: payloadlen=%zu, type=%u, flags=0x%02x, "
               "stream_id=%d\n",
               frame->hd.length, frame->hd.type, frame->hd.flags,
               frame->hd.stream_id);

        rv = session_call_before_frame_send(session, frame);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }

        if (rv == NGHTTP2_ERR_CANCEL) {
          int32_t opened_stream_id = 0;
          uint32_t error_code = NGHTTP2_INTERNAL_ERROR;

          if (session->callbacks.on_frame_not_send_callback) {
            if (session->callbacks.on_frame_not_send_callback(
                    session, frame, rv, session->user_data) != 0) {
              return NGHTTP2_ERR_CALLBACK_FAILURE;
            }
          }

          /* We have to close stream opened by canceled request
             HEADERS or PUSH_PROMISE. */
          switch (item->frame.hd.type) {
          case NGHTTP2_HEADERS:
            if (item->frame.headers.cat == NGHTTP2_HCAT_REQUEST) {
              opened_stream_id = item->frame.hd.stream_id;
              /* We don't have to check
                 item->aux_data.headers.canceled since it has already
                 been checked. */
              /* Set error_code to REFUSED_STREAM so that application
                 can send request again. */
              error_code = NGHTTP2_REFUSED_STREAM;
            }
            break;
          case NGHTTP2_PUSH_PROMISE:
            opened_stream_id = item->frame.push_promise.promised_stream_id;
            break;
          }
          if (opened_stream_id) {
            /* careful not to override rv */
            int rv2;
            rv2 = nghttp2_session_close_stream(session, opened_stream_id,
                                               error_code);

            if (nghttp2_is_fatal(rv2)) {
              return rv2;
            }
          }

          active_outbound_item_reset(aob, mem);

          break;
        }
      } else {
        DEBUGF("send: next frame: DATA\n");

        if (item->aux_data.data.no_copy) {
          aob->state = NGHTTP2_OB_SEND_NO_COPY;
          break;
        }
      }

      DEBUGF("send: start transmitting frame type=%u, length=%zd\n",
             framebufs->cur->buf.pos[3],
             framebufs->cur->buf.last - framebufs->cur->buf.pos);

      aob->state = NGHTTP2_OB_SEND_DATA;

      break;
    }
    case NGHTTP2_OB_SEND_DATA: {
      size_t datalen;
      nghttp2_buf *buf;

      buf = &framebufs->cur->buf;

      if (buf->pos == buf->last) {
        DEBUGF("send: end transmission of a frame\n");

        /* Frame has completely sent */
        if (fast_cb) {
          rv = session_after_frame_sent2(session);
        } else {
          rv = session_after_frame_sent1(session);
          if (rv < 0) {
            /* FATAL */
            assert(nghttp2_is_fatal(rv));
            return rv;
          }
          rv = session_after_frame_sent2(session);
        }
        if (rv < 0) {
          /* FATAL */
          assert(nghttp2_is_fatal(rv));
          return rv;
        }
        /* We have already adjusted the next state */
        break;
      }

      *data_ptr = buf->pos;
      datalen = nghttp2_buf_len(buf);

      /* We increment the offset here. If send_callback does not send
         everything, we will adjust it. */
      buf->pos += datalen;

      return (ssize_t)datalen;
    }
    case NGHTTP2_OB_SEND_NO_COPY: {
      nghttp2_stream *stream;
      nghttp2_frame *frame;
      int pause;

      DEBUGF("send: no copy DATA\n");

      frame = &aob->item->frame;

      stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
      if (stream == NULL) {
        DEBUGF("send: no copy DATA cancelled because stream was closed\n");

        active_outbound_item_reset(aob, mem);

        break;
      }

      rv = session_call_send_data(session, aob->item, framebufs);
      if (nghttp2_is_fatal(rv)) {
        return rv;
      }

      if (rv == NGHTTP2_ERR_TEMPORAL_CALLBACK_FAILURE) {
        rv = session_detach_stream_item(session, stream);

        if (nghttp2_is_fatal(rv)) {
          return rv;
        }

        rv = nghttp2_session_add_rst_stream(session, frame->hd.stream_id,
                                            NGHTTP2_INTERNAL_ERROR);
        if (nghttp2_is_fatal(rv)) {
          return rv;
        }

        active_outbound_item_reset(aob, mem);

        break;
      }

      if (rv == NGHTTP2_ERR_WOULDBLOCK) {
        return 0;
      }

      pause = (rv == NGHTTP2_ERR_PAUSE);

      rv = session_after_frame_sent1(session);
      if (rv < 0) {
        assert(nghttp2_is_fatal(rv));
        return rv;
      }
      rv = session_after_frame_sent2(session);
      if (rv < 0) {
        assert(nghttp2_is_fatal(rv));
        return rv;
      }

      /* We have already adjusted the next state */

      if (pause) {
        return 0;
      }

      break;
    }
    case NGHTTP2_OB_SEND_CLIENT_MAGIC: {
      size_t datalen;
      nghttp2_buf *buf;

      buf = &framebufs->cur->buf;

      if (buf->pos == buf->last) {
        DEBUGF("send: end transmission of client magic\n");
        active_outbound_item_reset(aob, mem);
        break;
      }

      *data_ptr = buf->pos;
      datalen = nghttp2_buf_len(buf);

      buf->pos += datalen;

      return (ssize_t)datalen;
    }
    }
  }
}